

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkHaigRecreateAig(Abc_Ntk_t *pNtk,Hop_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  Abc_Obj_t *pOld;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  
  if (p->nCreated != p->vObjs->nSize) {
    __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                  ,0x15e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pAVar6 = Abc_AigConst1(pNtk_00);
  (p->pConst1->field_1).pNext = (Hop_Obj_t *)pAVar6;
  pVVar8 = p->vPis;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (pNtk_00->vCis->nSize <= lVar7) goto LAB_0087348f;
      *(void **)((long)pVVar8->pArray[lVar7] + 8) = pNtk_00->vCis->pArray[lVar7];
      lVar7 = lVar7 + 1;
      pVVar8 = p->vPis;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar8->pArray[lVar7];
      if ((*(uint *)((long)pvVar1 + 0x20) & 6) == 4) {
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                            *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 8)),
                            (Abc_Obj_t *)
                            ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x18) & 1) ^
                            *(ulong *)((*(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe) + 8)))
        ;
        *(Abc_Obj_t **)((long)pvVar1 + 8) = pAVar6;
        if (((ulong)pAVar6 & 1) != 0) {
          __assert_fail("!Hop_IsComplement(pObj->pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x16e,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = p->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (p->vPos->nSize <= lVar7) {
LAB_0087348f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar2 = *(ulong *)((long)p->vPos->pArray[lVar7] + 0x10);
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar8->pArray[lVar7] + 0x40),
                      (Abc_Obj_t *)
                      ((ulong)((uint)uVar2 & 1) ^ *(ulong *)((uVar2 & 0xfffffffffffffffe) + 8)));
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar7];
      plVar4 = (long *)*plVar3;
      if ((plVar4 != plVar3 && plVar4 != (long *)0x0) && ((*(uint *)(plVar4 + 4) & 6) == 4)) {
        pAVar6 = (Abc_Obj_t *)plVar3[1];
        if ((pAVar6->field_5).pData != (void *)0x0) {
          __assert_fail("pObjAbcThis->pData == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x185,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
        }
        if ((pAVar6->vFanouts).nSize != 0) {
          __assert_fail("Abc_ObjFanoutNum(pObjAbcThis) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x187,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
        }
        pOld = (Abc_Obj_t *)plVar4[1];
        if (pOld == pAVar6) {
          __assert_fail("pObjAbcRepr != pObjAbcThis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0x189,"Abc_Ntk_t *Abc_NtkHaigRecreateAig(Abc_Ntk_t *, Hop_Man_t *)");
        }
        iVar5 = Abc_NtkHaigCheckTfi(pNtk_00,pOld,pAVar6);
        if (iVar5 == 0) {
          do {
            pAVar9 = pOld;
            pOld = (Abc_Obj_t *)(pAVar9->field_5).pData;
          } while (pOld != (Abc_Obj_t *)0x0);
          (pAVar9->field_5).pData = pAVar6;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = p->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    puts("Abc_NtkHaigUse: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkHaigRecreateAig( Abc_Ntk_t * pNtk, Hop_Man_t * p )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObjOld, * pObjAbcThis, * pObjAbcRepr;
    Hop_Obj_t * pObj;
    int i;
    assert( p->nCreated == Vec_PtrSize(p->vObjs) );

    // start the new network
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );

    // transfer new nodes to the PIs of HOP
    Hop_ManConst1(p)->pNext = (Hop_Obj_t *)Abc_AigConst1( pNtkAig );
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = (Hop_Obj_t *)Abc_NtkCi( pNtkAig, i );

    // construct new nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = (Hop_Obj_t *)Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Hop_IsComplement(pObj->pNext) );
    }

    // set the COs
    Abc_NtkForEachCo( pNtk, pObjOld, i )
        Abc_ObjAddFanin( pObjOld->pCopy, Hop_ObjChild0Next(Hop_ManPo(p,i)) );

    // construct choice nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        // skip the node without choices
        if ( pObj->pData == NULL )
            continue;
        // skip the representative of the class
        if ( pObj->pData == pObj )
            continue;
        // do not create choices for constant 1 and PIs
        if ( !Hop_ObjIsNode((Hop_Obj_t *)pObj->pData) )
            continue;
        // get the corresponding new nodes
        pObjAbcThis = (Abc_Obj_t *)pObj->pNext;
        pObjAbcRepr = (Abc_Obj_t *)((Hop_Obj_t *)pObj->pData)->pNext;
        // the new node cannot be already in the class
        assert( pObjAbcThis->pData == NULL );
        // the new node cannot have fanouts
        assert( Abc_ObjFanoutNum(pObjAbcThis) == 0 );
        // these should be different nodes
        assert( pObjAbcRepr != pObjAbcThis );
        // do not create choices if there is a path from pObjAbcThis to pObjAbcRepr
        if ( !Abc_NtkHaigCheckTfi( pNtkAig, pObjAbcRepr, pObjAbcThis ) )
        {
            // find the last node in the class
            while ( pObjAbcRepr->pData )
                pObjAbcRepr = (Abc_Obj_t *)pObjAbcRepr->pData;
            // add the new node at the end of the list
            pObjAbcRepr->pData = pObjAbcThis;
        }
    }

    // finish the new network
//    Abc_NtkFinalize( pNtk, pNtkAig );
//    Abc_AigCleanup( pNtkAig->pManFunc );
    // check correctness of the network
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkHaigUse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}